

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O2

ChQuaternion<double> *
chrono::Q_from_Vect_to_Vect
          (ChQuaternion<double> *__return_storage_ptr__,ChVector<double> *fr_vect,
          ChVector<double> *to_vect)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ChVector<double> local_98;
  ChVector<double> local_78;
  ChVector<double> local_58;
  ChVector<double> local_38;
  
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  dVar8 = ChVector<double>::Length(fr_vect);
  dVar9 = ChVector<double>::Length(to_vect);
  ChVector<double>::operator%(&local_78,fr_vect,to_vect);
  local_98.m_data[0] = local_78.m_data[0];
  local_98.m_data[1] = local_78.m_data[1];
  local_98.m_data[2] = local_78.m_data[2];
  dVar10 = ChVector<double>::Length(&local_98);
  auVar19 = ZEXT816(0x3ff0000000000000);
  auVar11._0_8_ = dVar10 / (dVar9 * dVar8);
  auVar11._8_8_ = extraout_XMM0_Qb;
  dVar8 = 1.0 / (dVar9 * dVar8);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = fr_vect->m_data[0];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar8 * to_vect->m_data[0];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar8 * to_vect->m_data[1] * fr_vect->m_data[1];
  auVar1 = vfmadd231sd_fma(auVar18,auVar16,auVar1);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = fr_vect->m_data[2];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar8 * to_vect->m_data[2];
  auVar1 = vfmadd231sd_fma(auVar1,auVar14,auVar7);
  auVar5._8_8_ = 0x7fffffffffffffff;
  auVar5._0_8_ = 0x7fffffffffffffff;
  auVar7 = vandpd_avx512vl(auVar11,auVar5);
  bVar6 = auVar11._0_8_ < -1.0;
  uVar3 = vcmpsd_avx512f(auVar1,ZEXT816(0xbff0000000000000),1);
  bVar4 = (bool)((byte)uVar3 & 1);
  auVar1 = vminsd_avx(auVar19,auVar1);
  dVar8 = (double)((ulong)bVar4 * -0x4010000000000000 + (ulong)!bVar4 * auVar1._0_8_);
  uVar3 = vcmpsd_avx512f(auVar19,auVar11,1);
  bVar4 = (bool)((byte)uVar3 & 1);
  dVar9 = (double)((ulong)bVar6 * 0x3ff0000000000000 +
                  (ulong)!bVar6 * ((ulong)bVar4 * 0x3ff0000000000000 + (ulong)!bVar4 * auVar7._0_8_)
                  );
  if ((dVar9 != 0.0) || (dVar8 <= 0.0)) {
    if ((1e-06 <= dVar9) || (0.0 <= dVar8)) {
      auVar1 = vminsd_avx(auVar19,auVar11);
      ChVector<double>::Normalize(&local_98);
      dVar8 = ChAtan2(dVar8,(double)((ulong)bVar6 * -0x4010000000000000 +
                                    (ulong)!bVar6 * auVar1._0_8_));
      dVar9 = sin(dVar8 * 0.5);
      dVar8 = cos(dVar8 * 0.5);
      __return_storage_ptr__->m_data[0] = dVar8;
      local_98.m_data[2] = dVar9 * local_98.m_data[2];
      __return_storage_ptr__->m_data[1] = dVar9 * local_98.m_data[0];
      __return_storage_ptr__->m_data[2] = dVar9 * local_98.m_data[1];
    }
    else {
      ChVector<double>::GetOrthogonalVector(&local_78,fr_vect);
      auVar12._0_8_ = -to_vect->m_data[2];
      auVar12._8_4_ = 0;
      auVar12._12_4_ = 0x80000000;
      local_58.m_data[0]._0_4_ = *(undefined4 *)to_vect->m_data;
      local_58.m_data[1]._0_4_ = *(undefined4 *)(to_vect->m_data + 1);
      local_58.m_data[0]._4_4_ = *(uint *)((long)to_vect->m_data + 4) ^ 0x80000000;
      local_58.m_data[1]._4_4_ = *(uint *)((long)to_vect->m_data + 0xc) ^ 0x80000000;
      local_58.m_data[2] = (double)vmovlps_avx(auVar12);
      ChVector<double>::GetOrthogonalVector(&local_38,&local_58);
      local_98.m_data[2] = local_78.m_data[2] + local_38.m_data[2];
      local_98.m_data[0] = local_78.m_data[0] + local_38.m_data[0];
      local_98.m_data[1] = local_78.m_data[1] + local_38.m_data[1];
      ChVector<double>::Normalize(&local_98);
      auVar19._8_8_ = local_98.m_data[1];
      auVar19._0_8_ = local_98.m_data[0];
      auVar15._8_8_ = &DAT_bff0000000000000;
      auVar15._0_8_ = &DAT_bff0000000000000;
      auVar17._8_8_ = 0x3ff0000000000000;
      auVar17._0_8_ = 0x3ff0000000000000;
      __return_storage_ptr__->m_data[0] = 0.0;
      uVar2 = vcmppd_avx512vl(auVar19,auVar15,1);
      auVar1 = vminpd_avx(auVar17,auVar19);
      bVar4 = (bool)((byte)(uVar2 & 3) & 1);
      uVar2 = (uVar2 & 3) >> 1;
      __return_storage_ptr__->m_data[1] =
           (double)((ulong)bVar4 * -0x4010000000000000 | (ulong)!bVar4 * auVar1._0_8_);
      __return_storage_ptr__->m_data[2] =
           (double)(uVar2 * -0x4010000000000000 | (ulong)!SUB81(uVar2,0) * auVar1._8_8_);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_98.m_data[2];
      uVar3 = vcmpsd_avx512f(auVar13,ZEXT816(0xbff0000000000000),1);
      bVar4 = (bool)((byte)uVar3 & 1);
      auVar1 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar13);
      local_98.m_data[2] =
           (double)((ulong)bVar4 * -0x4010000000000000 + (ulong)!bVar4 * auVar1._0_8_);
    }
    __return_storage_ptr__->m_data[3] = local_98.m_data[2];
  }
  else {
    __return_storage_ptr__->m_data[0] = 1.0;
    __return_storage_ptr__->m_data[3] = 0.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    __return_storage_ptr__->m_data[2] = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> Q_from_Vect_to_Vect(const ChVector<double>& fr_vect, const ChVector<double>& to_vect) {
    const double ANGLE_TOLERANCE = 1e-6;
    ChQuaternion<double> quat;
    double halfang;
    double sinhalf;
    ChVector<double> axis;

    double lenXlen = fr_vect.Length() * to_vect.Length();
    axis = fr_vect % to_vect;
    double sinangle = ChClamp(axis.Length() / lenXlen, -1.0, +1.0);
    double cosangle = ChClamp(fr_vect ^ to_vect / lenXlen, -1.0, +1.0);

    // Consider three cases: Parallel, Opposite, non-collinear
    if (std::abs(sinangle) == 0.0 && cosangle > 0) {
        // fr_vect & to_vect are parallel
        quat.e0() = 1.0;
        quat.e1() = 0.0;
        quat.e2() = 0.0;
        quat.e3() = 0.0;
    } else if (std::abs(sinangle) < ANGLE_TOLERANCE && cosangle < 0) {
        // fr_vect & to_vect are opposite, i.e. ~180 deg apart
        axis = fr_vect.GetOrthogonalVector() + (-to_vect).GetOrthogonalVector();
        axis.Normalize();
        quat.e0() = 0.0;
        quat.e1() = ChClamp(axis.x(), -1.0, +1.0);
        quat.e2() = ChClamp(axis.y(), -1.0, +1.0);
        quat.e3() = ChClamp(axis.z(), -1.0, +1.0);
    } else {
        // fr_vect & to_vect are not co-linear case
        axis.Normalize();
        halfang = 0.5 * ChAtan2(cosangle, sinangle);
        sinhalf = sin(halfang);

        quat.e0() = cos(halfang);
        quat.e1() = sinhalf* axis.x();
        quat.e2() = sinhalf* axis.y();
        quat.e3() = sinhalf* axis.z();
    }
    return (quat);
}